

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

int __thiscall
QtPrivate::QGenericArrayOps<QVariant>::truncate
          (QGenericArrayOps<QVariant> *this,char *__file,__off_t __length)

{
  QVariant *pQVar1;
  QVariant *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QVariant> *this_00;
  
  pQVar1 = QArrayDataPointer<QVariant>::begin((QArrayDataPointer<QVariant> *)0x92e301);
  this_00 = (QArrayDataPointer<QVariant> *)(pQVar1 + (long)__file);
  QArrayDataPointer<QVariant>::end(this_00);
  std::destroy<QVariant*>((QVariant *)this_00,in_stack_ffffffffffffffd8);
  (this->super_QArrayDataPointer<QVariant>).size = (qsizetype)__file;
  return (int)this;
}

Assistant:

void truncate(size_t newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize < size_t(this->size));

        std::destroy(this->begin() + newSize, this->end());
        this->size = newSize;
    }